

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::
optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
::operator=(optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
            *this,optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
                  *other)

{
  value_type *pvVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
    }
    else {
      pvVar1 = operator*(other);
      std::
      pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      operator=((pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
                 *)&this->contained,pvVar1);
    }
  }
  else if (other->has_value_ != false) {
    pvVar1 = operator*(other);
    optional<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>>
    ::
    initialize<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>>
              ((optional<std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>>
                *)this,pvVar1);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }